

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O1

void __thiscall SpotLight_Power_Test::~SpotLight_Power_Test(SpotLight_Power_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SpotLight, Power) {
    static ConstantSpectrum I(10.);
    Transform id;
    SpotLight light(id, MediumInterface(), &I, 1.f /* scale */, 60 /* total width */,
                    40 /* falloff start */, Allocator());

    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
    SampledSpectrum phi = light.Phi(lambda);

    int nSamples = 1024 * 1024;
    double phiSampled = 0;
    for (int i = 0; i < nSamples; ++i) {
        Vector3f w = SampleUniformSphere({RadicalInverse(0, i), RadicalInverse(1, i)});
        phiSampled += (I.Sample(lambda) * light.Falloff(w))[0];
    }
    phiSampled /= (nSamples * UniformSpherePDF());

    EXPECT_LT(std::abs(phiSampled - phi[0]), 1e-3)
        << " qmc: " << phiSampled << ", closed-form: " << phi[0];
}